

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

BinaryExpr<const_om::net::ip4_addr_&,_const_om::net::ip4_addr_&> * __thiscall
Catch::ExprLhs<om::net::ip4_addr_const&>::operator==
          (BinaryExpr<const_om::net::ip4_addr_&,_const_om::net::ip4_addr_&> *__return_storage_ptr__,
          ExprLhs<om::net::ip4_addr_const&> *this,ip4_addr *rhs)

{
  ip4_addr *lhs;
  bool comparisonResult;
  StringRef local_30;
  ip4_addr *local_20;
  ip4_addr *rhs_local;
  ExprLhs<const_om::net::ip4_addr_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (ip4_addr *)this;
  this_local = (ExprLhs<const_om::net::ip4_addr_&> *)__return_storage_ptr__;
  comparisonResult = compareEqual<om::net::ip4_addr,om::net::ip4_addr>(*(ip4_addr **)this,rhs);
  lhs = *(ip4_addr **)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<const_om::net::ip4_addr_&,_const_om::net::ip4_addr_&>::BinaryExpr
            (__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }